

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.cpp
# Opt level: O2

void __thiscall
Jupiter::Timer::Timer
          (Timer *this,uint in_iterations,milliseconds in_delay,FunctionType in_function,
          void *in_parameters,bool in_immediate)

{
  long lVar1;
  undefined3 in_register_00000089;
  Timer *local_18;
  
  (this->super_Thinker)._vptr_Thinker = (_func_int **)&PTR_think_0015aae0;
  (this->m_next_call).__d.__r = 0;
  this->m_function = in_function;
  this->m_parameters = in_parameters;
  this->m_iterations = in_iterations;
  (this->m_delay).__r = in_delay.__r;
  lVar1 = std::chrono::_V2::steady_clock::now();
  (this->m_next_call).__d.__r = lVar1;
  if (CONCAT31(in_register_00000089,in_immediate) == 0) {
    (this->m_next_call).__d.__r = (this->m_delay).__r * 1000000 + lVar1;
  }
  local_18 = this;
  std::__cxx11::list<Jupiter::Timer_*,_std::allocator<Jupiter::Timer_*>_>::push_back
            (&o_timers_abi_cxx11_,&local_18);
  return;
}

Assistant:

Jupiter::Timer::Timer(unsigned int in_iterations, std::chrono::milliseconds in_delay, FunctionType in_function, void *in_parameters, bool in_immediate)
{
	m_function = in_function;
	m_parameters = in_parameters;
	m_iterations = in_iterations;
	m_delay = in_delay;
	m_next_call = std::chrono::steady_clock::now();

	if (in_immediate == false)
		m_next_call += m_delay;

	o_timers.push_back(this);
}